

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesPrepare(Fra_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  void *__s;
  Aig_Obj_t *pAVar4;
  long lVar5;
  ulong uVar6;
  Aig_Obj_t **ppAVar7;
  uint uVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  size_t __size;
  uint uVar15;
  int iVar16;
  Vec_Ptr_t *pVVar17;
  
  pVVar17 = p->pAig->vObjs;
  uVar12 = pVVar17->nSize;
  uVar8 = uVar12 - 1;
  do {
    uVar15 = uVar8 + 1;
    if ((uVar8 & 1) == 0) {
      uVar13 = 3;
      do {
        iVar11 = (int)uVar13;
        if (uVar15 < (uint)(iVar11 * iVar11)) {
          __size = (long)(int)uVar15 << 3;
          __ptr = calloc(1,__size);
          __s = malloc(__size);
          memset(__s,0xff,__size);
          p->vClasses1->nSize = 0;
          iVar11 = 0;
          goto LAB_004f3031;
        }
        uVar6 = (ulong)uVar15 % uVar13;
        uVar13 = (ulong)(iVar11 + 2);
      } while ((int)uVar6 != 0);
    }
    uVar12 = uVar12 + 1;
    uVar8 = uVar15;
  } while( true );
LAB_004f3031:
  if (pVVar17->nSize <= iVar11) goto LAB_004f3111;
  pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar17,iVar11);
  if (pAVar4 != (Aig_Obj_t *)0x0) {
    uVar8 = (uint)*(undefined8 *)&pAVar4->field_0x18;
    if (fLatchCorr == 0) {
      uVar8 = uVar8 & 7;
      if (((uVar8 == 2) || (uVar8 - 5 < 2)) &&
         ((nMaxLevs == 0 ||
          ((int)((uint)((ulong)*(undefined8 *)&pAVar4->field_0x18 >> 0x20) & 0xffffff) <= nMaxLevs))
         )) goto LAB_004f3066;
    }
    else if ((uVar8 & 7) == 2) {
LAB_004f3066:
      iVar2 = (*p->pFuncNodeHash)(pAVar4,uVar15);
      iVar3 = (*p->pFuncNodeIsConst)(pAVar4);
      if (iVar3 == 0) {
        lVar5 = *(long *)((long)__ptr + (long)iVar2 * 8);
        if (lVar5 == 0) {
          *(Aig_Obj_t **)((long)__ptr + (long)iVar2 * 8) = pAVar4;
          lVar5 = (long)pAVar4->Id;
        }
        else {
          lVar5 = (long)*(int *)(lVar5 + 0x24);
          *(undefined8 *)((long)__s + (long)pAVar4->Id * 8) = *(undefined8 *)((long)__s + lVar5 * 8)
          ;
        }
        *(Aig_Obj_t **)((long)__s + lVar5 * 8) = pAVar4;
      }
      else {
        Vec_PtrPush(p->vClasses1,pAVar4);
        *(Aig_Obj_t **)
         (*(long *)(*(long *)((long)(pAVar4->field_5).pData + 0x30) + 8) + (long)pAVar4->Id * 8) =
             p->pAig->pConst1;
      }
    }
  }
  iVar11 = iVar11 + 1;
  pVVar17 = p->pAig->vObjs;
  goto LAB_004f3031;
LAB_004f3111:
  uVar6 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar6;
  }
  iVar11 = 0;
  for (; uVar6 != uVar13; uVar6 = uVar6 + 1) {
    lVar5 = *(long *)((long)__ptr + uVar6 * 8);
    if ((lVar5 != 0) &&
       (lVar14 = *(long *)((long)__s + (long)*(int *)(lVar5 + 0x24) * 8), lVar5 != lVar14)) {
      uVar12 = 1;
      for (; lVar14 != lVar5; lVar14 = *(long *)((long)__s + (long)*(int *)(lVar14 + 0x24) * 8)) {
        uVar12 = uVar12 + 1;
      }
      if (uVar12 < 2) {
        __assert_fail("k > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0x150,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
      }
      if ((*(ulong *)(lVar5 + 0x18) & 0x10) != 0) {
        __assert_fail("ppTable[i]->fMarkA == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                      ,0x153,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
      }
      iVar11 = iVar11 + uVar12;
      *(ulong *)(lVar5 + 0x18) = *(ulong *)(lVar5 + 0x18) | 0x10;
    }
  }
  ppAVar7 = (Aig_Obj_t **)malloc(((long)p->vClasses1->nSize + (long)iVar11) * 0x10);
  p->pMemClasses = ppAVar7;
  p->pMemClassesFree = ppAVar7 + (uint)(iVar11 * 2);
  p->vClasses->nSize = 0;
  iVar11 = 0;
  iVar2 = 0;
  do {
    pVVar17 = p->pAig->vObjs;
    if (pVVar17->nSize <= iVar11) {
      free(__ptr);
      free(__s);
      Fra_ClassesRefine(p);
      return;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar17,iVar11);
    if (pAVar4 != (Aig_Obj_t *)0x0) {
      uVar13 = *(ulong *)&pAVar4->field_0x18;
      if (((uint)uVar13 & 7) - 7 < 0xfffffffe) {
        if (((uint)uVar13 & 0x17) == 0x12) {
LAB_004f31fb:
          *(ulong *)&pAVar4->field_0x18 = uVar13 & 0xffffffffffffffef;
          iVar3 = iVar2 * 2;
          Vec_PtrPush(p->vClasses,p->pMemClasses + iVar3);
          uVar12 = 1;
          pAVar9 = *(Aig_Obj_t **)((long)__s + (long)pAVar4->Id * 8);
          iVar16 = iVar3;
          for (pAVar10 = pAVar9; pAVar10 != pAVar4;
              pAVar10 = *(Aig_Obj_t **)((long)__s + (long)pAVar10->Id * 8)) {
            uVar12 = uVar12 + 1;
            iVar16 = iVar16 + 1;
          }
          if (uVar12 < 2) {
            __assert_fail("nNodes > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                          ,0x16d,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
          }
          p->pMemClasses[iVar3] = pAVar4;
          while (iVar2 = iVar2 + 1, pAVar9 != pAVar4) {
            p->pMemClasses[iVar16] = pAVar9;
            iVar1 = pAVar9->Id;
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar9->field_5).pData + 0x30) + 8) + (long)iVar1 * 8) =
                 pAVar4;
            iVar16 = iVar16 + -1;
            pAVar9 = *(Aig_Obj_t **)((long)__s + (long)iVar1 * 8);
          }
          p->pMemClasses[(int)(uVar12 + iVar3)] = (Aig_Obj_t *)0x0;
        }
      }
      else if ((uVar13 & 0x10) != 0) goto LAB_004f31fb;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void Fra_ClassesPrepare( Fra_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts;
    Aig_Obj_t * pObj, * pTemp;
    int i, k, nTableSize, nEntries, nNodes, iEntry;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig) );
    ppTable = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    memset( ppTable, 0, sizeof(Aig_Obj_t *) * nTableSize );

    // add all the nodes to the hash table
    Vec_PtrClear( p->vClasses1 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( pObj, nTableSize );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( pObj ) )
        {
            Vec_PtrPush( p->vClasses1, pObj );
            Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pAig) );
            continue;
        }
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
            Fra_ObjSetNext( ppNexts, pObj, pObj );
        }
        else
        {
            Fra_ObjSetNext( ppNexts, pObj, Fra_ObjNext(ppNexts,ppTable[iEntry]) );
            Fra_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
        }
    }

    // count the total number of nodes in the non-trivial classes
    // mark the representative nodes of each equivalence class
    nEntries = 0;
    for ( i = 0; i < nTableSize; i++ )
        if ( ppTable[i] && ppTable[i] != Fra_ObjNext(ppNexts, ppTable[i]) )
        {
            for ( pTemp = Fra_ObjNext(ppNexts, ppTable[i]), k = 1; 
                  pTemp != ppTable[i]; 
                  pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
            assert( k > 1 );
            nEntries += k;
            // mark the node
            assert( ppTable[i]->fMarkA == 0 );
            ppTable[i]->fMarkA = 1;
        }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->vClasses1)) );
    p->pMemClassesFree = p->pMemClasses + 2*nEntries;
 
    // copy the entries into storage in the topological order
    Vec_PtrClear( p->vClasses );
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        // skip the nodes that are not representatives of non-trivial classes
        if ( pObj->fMarkA == 0 )
            continue;
        pObj->fMarkA = 0;
        // add the class of nodes
        Vec_PtrPush( p->vClasses, p->pMemClasses + 2*nEntries );
        // count the number of entries in this class
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
        nNodes = k;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        p->pMemClasses[2*nEntries] = pObj;
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ )
        {
            p->pMemClasses[2*nEntries+nNodes-k] = pTemp;
            Fra_ClassObjSetRepr( pTemp, pObj );
        }
        // add as many empty entries
        p->pMemClasses[2*nEntries + nNodes] = NULL;
        // increment the number of entries
        nEntries += k;
    }
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Fra_ClassesRefine( p );
//    Fra_ClassesPrint( p, 0 );
}